

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O3

pool_ptr<soul::Module> __thiscall
soul::Program::ProgramImpl::findModuleWithName(ProgramImpl *this,string *name)

{
  long *plVar1;
  void *__s2;
  size_t __n;
  int iVar2;
  undefined8 *in_RDX;
  long lVar3;
  pool_ref<soul::Module> *m;
  long *plVar4;
  
  plVar4 = (long *)name[2]._M_dataplus._M_p;
  plVar1 = (long *)name[2]._M_string_length;
  if (plVar4 != plVar1) {
    __s2 = (void *)*in_RDX;
    __n = in_RDX[1];
    do {
      lVar3 = *plVar4;
      if (*(size_t *)(lVar3 + 0x38) == __n) {
        if (__n == 0) goto LAB_001c2e8d;
        iVar2 = bcmp(*(void **)(lVar3 + 0x30),__s2,__n);
        if (iVar2 == 0) goto LAB_001c2e8d;
      }
      plVar4 = plVar4 + 1;
    } while (plVar4 != plVar1);
  }
  lVar3 = 0;
LAB_001c2e8d:
  *(long *)this = lVar3;
  return (pool_ptr<soul::Module>)(Module *)this;
}

Assistant:

pool_ptr<Module> findModuleWithName (const std::string& name) const
    {
        for (auto& m : modules)
            if (m->fullName == name)
                return m;

        return {};
    }